

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_spi_setClockDivider(uint16_t divider)

{
  undefined6 in_register_0000003a;
  
  bcm2835_peri_write(bcm2835_spi0 + 2,(uint32_t)CONCAT62(in_register_0000003a,divider));
  return;
}

Assistant:

void bcm2835_spi_setClockDivider(uint16_t divider)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CLK/4;
    bcm2835_peri_write(paddr, divider);
}